

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void diy::Serialization<diy::AMRLink::Description>::save(BinaryBuffer *bb,Description *x)

{
  (*bb->_vptr_BinaryBuffer[2])(bb,x,4);
  Serialization<diy::DynamicPoint<int,_4UL>_>::save(bb,&x->refinement);
  Serialization<diy::Bounds<int>_>::save(bb,&x->core);
  Serialization<diy::Bounds<int>_>::save(bb,&x->bounds);
  return;
}

Assistant:

static void         save(diy::BinaryBuffer& bb, const diy::AMRLink::Description& x)
        {
            diy::save(bb, x.level);
            diy::save(bb, x.refinement);
            diy::save(bb, x.core);
            diy::save(bb, x.bounds);
        }